

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O2

size_t __thiscall
Memory::
SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
::Check(SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
        *this,bool checkCount)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  size_t sVar4;
  Recycler *pRVar5;
  size_t sVar6;
  size_t sVar7;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *in_R8;
  ulong uVar8;
  undefined8 *in_FS_OFFSET;
  
  sVar4 = HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
          ::Check(&this->
                   super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                  ,false);
  if (this->partialHeapBlockList !=
      (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    pRVar5 = HeapBucket::GetRecycler((HeapBucket *)this);
    if (pRVar5->inPartialCollectMode == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,0x2de,
                         "(partialHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode)"
                         ,
                         "partialHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode"
                        );
      if (!bVar3) goto LAB_002c1d7c;
      *puVar1 = 0;
    }
  }
  sVar6 = HeapInfo::
          Check<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
                    ((HeapInfo *)0x0,false,SUB81(this->partialHeapBlockList,0),
                     (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
                     in_R8);
  if (this->partialSweptHeapBlockList !=
      (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    pRVar5 = HeapBucket::GetRecycler((HeapBucket *)this);
    if (pRVar5->inPartialCollectMode == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,0x2e2,
                         "(partialSweptHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode)"
                         ,
                         "partialSweptHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode"
                        );
      if (!bVar3) goto LAB_002c1d7c;
      *puVar1 = 0;
    }
  }
  sVar7 = HeapInfo::
          Check<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
                    ((HeapInfo *)0x0,false,SUB81(this->partialSweptHeapBlockList,0),
                     (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
                     in_R8);
  uVar8 = sVar7 + sVar6 + sVar4;
  if ((checkCount) &&
     (uVar8 != (this->
               super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
               ).super_HeapBucket.heapBlockCount)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x2e6,"(!checkCount || this->heapBlockCount == smallHeapBlockCount)",
                       "!checkCount || this->heapBlockCount == smallHeapBlockCount");
    if (!bVar3) {
LAB_002c1d7c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  return uVar8;
}

Assistant:

size_t
SmallNormalHeapBucketBase<TBlockType>::Check(bool checkCount)
{
    size_t smallHeapBlockCount = __super::Check(false);
    Assert(partialHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode);
    smallHeapBlockCount += HeapInfo::Check(false, false, this->partialHeapBlockList);

#if ENABLE_CONCURRENT_GC
    Assert(partialSweptHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode);
    smallHeapBlockCount += HeapInfo::Check(false, false, this->partialSweptHeapBlockList);
#endif

    Assert(!checkCount || this->heapBlockCount == smallHeapBlockCount);
    return smallHeapBlockCount;
}